

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_name_unittest.cc
# Opt level: O0

void __thiscall
bssl::ParseNameTest_RFC2253FormatUnknownOid_Test::TestBody
          (ParseNameTest_RFC2253FormatUnknownOid_Test *this)

{
  Input name_tlv;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_178;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar;
  AssertHelper local_138;
  Message local_130;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__1;
  string output;
  string local_e8;
  AssertHelper local_c8;
  Message local_c0 [3];
  uchar *local_a8;
  uchar *puStack_a0;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  RDNSequence rdn;
  undefined1 auStack_58 [8];
  Input rdn_input;
  uint8_t der [50];
  ParseNameTest_RFC2253FormatUnknownOid_Test *this_local;
  
  rdn_input.data_.size_ = 0x30609300b313030;
  Span<unsigned_char_const>::Span<50ul>
            ((Span<unsigned_char_const> *)
             &rdn.
              super__Vector_base<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (uchar (*) [50])&rdn_input.data_.size_);
  bssl::der::Input::Input((Input *)auStack_58,stack0xffffffffffffff98);
  ::std::
  vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
  ::vector((vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
            *)&gtest_ar_.message_);
  local_a8 = (uchar *)auStack_58;
  puStack_a0 = rdn_input.data_.data_;
  name_tlv.data_.size_ = (size_t)rdn_input.data_.data_;
  name_tlv.data_.data_ = (uchar *)auStack_58;
  local_91 = ParseName(name_tlv,(RDNSequence *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_90,&local_91,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,(internal *)local_90,(AssertionResult *)"ParseName(rdn_input, &rdn)",
               "false","true",in_R9);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
               ,0x14c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    ::std::__cxx11::string::~string((string *)&local_e8);
    testing::Message::~Message(local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  if (bVar1) {
    ::std::__cxx11::string::string((string *)&gtest_ar__1.message_);
    local_121 = ConvertToRFC2253((RDNSequence *)&gtest_ar_.message_,(string *)&gtest_ar__1.message_)
    ;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_120,&local_121,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
    if (!bVar1) {
      testing::Message::Message(&local_130);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_120,
                 (AssertionResult *)"ConvertToRFC2253(rdn, &output)","false","true",in_R9);
      pcVar2 = (char *)::std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
                 ,0x14e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_138,&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      ::std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_130);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
    if (bVar1) {
      testing::internal::EqHelper::
      Compare<char[41],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((EqHelper *)local_168,"\"1.3.6.1.4.1.1466.0=#04024869,O=Test,C=GB\"","output",
                 (char (*) [41])"1.3.6.1.4.1.1466.0=#04024869,O=Test,C=GB",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &gtest_ar__1.message_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
      if (!bVar1) {
        testing::Message::Message(&local_170);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name_unittest.cc"
                   ,0x14f,pcVar2);
        testing::internal::AssertHelper::operator=(&local_178,&local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        testing::Message::~Message(&local_170);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
    }
    ::std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
  }
  ::std::
  vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
  ::~vector((vector<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>,_std::allocator<std::vector<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>_>_>
             *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ParseNameTest, RFC2253FormatUnknownOid) {
  const uint8_t der[] = {0x30, 0x30, 0x31, 0x0b, 0x30, 0x09, 0x06, 0x03, 0x55,
                         0x04, 0x06, 0x13, 0x02, 0x47, 0x42, 0x31, 0x0d, 0x30,
                         0x0b, 0x06, 0x03, 0x55, 0x04, 0x0a, 0x13, 0x04, 0x54,
                         0x65, 0x73, 0x74, 0x31, 0x12, 0x30, 0x10, 0x06, 0x08,
                         0x2b, 0x06, 0x01, 0x04, 0x01, 0x8b, 0x3a, 0x00, 0x13,
                         0x04, 0x04, 0x02, 0x48, 0x69};
  der::Input rdn_input(der);
  RDNSequence rdn;
  ASSERT_TRUE(ParseName(rdn_input, &rdn));
  std::string output;
  ASSERT_TRUE(ConvertToRFC2253(rdn, &output));
  ASSERT_EQ("1.3.6.1.4.1.1466.0=#04024869,O=Test,C=GB", output);
}